

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  parasail_result_t *result;
  __m128i *palVar12;
  __m128i *palVar13;
  __m128i *palVar14;
  __m128i *b;
  __m128i *palVar15;
  undefined4 in_register_0000000c;
  size_t len;
  char *pcVar16;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  ulong uVar17;
  char *__format;
  ulong uVar18;
  int iVar19;
  long lVar20;
  short sVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  short sVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar41 [16];
  short sVar49;
  undefined1 auVar42 [16];
  ushort uVar50;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar51 [16];
  __m128i c;
  __m128i c_00;
  ulong local_a0;
  short sVar29;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  
  len = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "open";
        }
        else {
          if (-1 < gap) {
            iVar11 = ppVar5->max;
            result = parasail_result_new();
            if (result != (parasail_result_t *)0x0) {
              uVar17 = (ulong)uVar3 + 7 >> 3;
              result->flag = result->flag | 0x8200804;
              palVar12 = parasail_memalign___m128i(0x10,uVar17);
              palVar13 = parasail_memalign___m128i(0x10,uVar17);
              palVar14 = parasail_memalign___m128i(0x10,uVar17);
              b = parasail_memalign___m128i(0x10,uVar17);
              auVar24._0_4_ = -(uint)((int)((ulong)palVar12 >> 0x20) == 0 && (int)palVar12 == 0);
              auVar24._4_4_ = -(uint)((int)palVar13 == 0 && (int)((ulong)palVar13 >> 0x20) == 0);
              auVar24._8_4_ = -(uint)((int)((ulong)palVar14 >> 0x20) == 0 && (int)palVar14 == 0);
              auVar24._12_4_ = -(uint)((int)b == 0 && (int)((ulong)b >> 0x20) == 0);
              iVar10 = movmskps((int)b,auVar24);
              if (iVar10 == 0) {
                local_a0 = 0;
                auVar24 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar22 = auVar24._0_4_;
                auVar24 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar23 = auVar24._0_4_;
                c[1] = extraout_RDX;
                c[0] = uVar17;
                parasail_memset___m128i(palVar12,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar17;
                parasail_memset___m128i(b,c_00,len);
                auVar24 = _DAT_008a1ec0;
                uVar6 = (uint)uVar17;
                auVar26._0_4_ = 0x8000;
                uVar18 = 0;
                auVar9._4_4_ = uVar22;
                auVar9._0_4_ = uVar22;
                auVar9._8_4_ = uVar22;
                auVar9._12_4_ = uVar22;
                auVar8._4_4_ = uVar23;
                auVar8._0_4_ = uVar23;
                auVar8._8_4_ = uVar23;
                auVar8._12_4_ = uVar23;
                auVar41 = _DAT_008a1ec0;
                auVar27 = _DAT_008a1ec0;
                do {
                  if (uVar18 == (uint)s2Len) {
LAB_00519851:
                    sVar21 = (short)auVar26._0_4_;
                    if (sVar21 == 0x7fff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar11 = parasail_result_is_saturated(result);
                    palVar15 = palVar14;
                    if (iVar11 == 0) {
                      if ((int)local_a0 == s2Len + -2) {
                        palVar15 = palVar13;
                      }
                      if ((int)local_a0 == s2Len + -1) {
                        palVar15 = palVar12;
                        palVar12 = palVar14;
                      }
                      iVar11 = uVar3 - 1;
                      for (uVar17 = 0; (uVar6 & 0xfffffff) << 3 != (uint)uVar17; uVar17 = uVar17 + 1
                          ) {
                        if ((*(short *)((long)*palVar15 + uVar17 * 2) == sVar21) &&
                           (iVar10 = ((uint)uVar17 & 7) * uVar6 + ((uint)(uVar17 >> 3) & 0x1fffffff)
                           , iVar10 < iVar11)) {
                          iVar11 = iVar10;
                        }
                      }
                      if ((int)local_a0 != s2Len + -2) {
                        palVar14 = palVar13;
                      }
                      if ((int)local_a0 != s2Len + -1) {
                        palVar13 = palVar14;
                      }
                      iVar10 = sVar21 + 0x8000;
                    }
                    else {
                      local_a0._0_4_ = 0;
                      iVar10 = 0xffff;
                      iVar11 = 0;
                    }
                    result->score = iVar10;
                    result->end_query = iVar11;
                    result->end_ref = (int)local_a0;
                    parasail_free(b);
                    parasail_free(palVar15);
                    parasail_free(palVar13);
                    parasail_free(palVar12);
                    return result;
                  }
                  uVar7 = palVar12[uVar6 - 1][0];
                  auVar38._0_8_ = uVar7 << 0x10;
                  auVar38._8_8_ = palVar12[uVar6 - 1][1] << 0x10 | uVar7 >> 0x30;
                  auVar38 = auVar38 | ZEXT416(0x8000);
                  iVar10 = ppVar5->mapper[(byte)s2[uVar18]];
                  iVar19 = (int)uVar18 + -2;
                  palVar15 = palVar13;
                  if ((int)local_a0 == iVar19) {
                    palVar15 = palVar14;
                  }
                  auVar31 = auVar24;
                  for (lVar20 = 0; uVar17 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
                    auVar39 = paddsw(auVar38,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar20 + (long)(int)(iVar10 * uVar6) * 0x10));
                    auVar38 = *(undefined1 (*) [16])((long)*b + lVar20);
                    sVar21 = auVar31._0_2_;
                    sVar25 = auVar38._0_2_;
                    uVar50 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._2_2_;
                    sVar25 = auVar38._2_2_;
                    uVar52 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._4_2_;
                    sVar25 = auVar38._4_2_;
                    uVar53 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._6_2_;
                    sVar25 = auVar38._6_2_;
                    uVar54 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._8_2_;
                    sVar25 = auVar38._8_2_;
                    uVar55 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._10_2_;
                    sVar25 = auVar38._10_2_;
                    uVar56 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._12_2_;
                    sVar25 = auVar38._12_2_;
                    sVar37 = auVar38._14_2_;
                    uVar57 = (ushort)(sVar25 < sVar21) * sVar21 |
                             (ushort)(sVar25 >= sVar21) * sVar25;
                    sVar21 = auVar31._14_2_;
                    uVar58 = (ushort)(sVar37 < sVar21) * sVar21 |
                             (ushort)(sVar37 >= sVar21) * sVar37;
                    sVar21 = auVar39._0_2_;
                    auVar51._0_2_ =
                         (ushort)((short)uVar50 < sVar21) * sVar21 |
                         ((short)uVar50 >= sVar21) * uVar50;
                    sVar21 = auVar39._2_2_;
                    auVar51._2_2_ =
                         (ushort)((short)uVar52 < sVar21) * sVar21 |
                         ((short)uVar52 >= sVar21) * uVar52;
                    sVar21 = auVar39._4_2_;
                    auVar51._4_2_ =
                         (ushort)((short)uVar53 < sVar21) * sVar21 |
                         ((short)uVar53 >= sVar21) * uVar53;
                    sVar21 = auVar39._6_2_;
                    auVar51._6_2_ =
                         (ushort)((short)uVar54 < sVar21) * sVar21 |
                         ((short)uVar54 >= sVar21) * uVar54;
                    sVar21 = auVar39._8_2_;
                    auVar51._8_2_ =
                         (ushort)((short)uVar55 < sVar21) * sVar21 |
                         ((short)uVar55 >= sVar21) * uVar55;
                    sVar21 = auVar39._10_2_;
                    auVar51._10_2_ =
                         (ushort)((short)uVar56 < sVar21) * sVar21 |
                         ((short)uVar56 >= sVar21) * uVar56;
                    sVar21 = auVar39._12_2_;
                    auVar51._12_2_ =
                         (ushort)((short)uVar57 < sVar21) * sVar21 |
                         ((short)uVar57 >= sVar21) * uVar57;
                    sVar21 = auVar39._14_2_;
                    auVar51._14_2_ =
                         (ushort)((short)uVar58 < sVar21) * sVar21 |
                         ((short)uVar58 >= sVar21) * uVar58;
                    *(undefined1 (*) [16])((long)*palVar15 + lVar20) = auVar51;
                    sVar21 = auVar41._0_2_;
                    auVar39._0_2_ =
                         (sVar21 < (short)auVar51._0_2_) * auVar51._0_2_ |
                         (ushort)(sVar21 >= (short)auVar51._0_2_) * sVar21;
                    sVar21 = auVar41._2_2_;
                    auVar39._2_2_ =
                         (sVar21 < (short)auVar51._2_2_) * auVar51._2_2_ |
                         (ushort)(sVar21 >= (short)auVar51._2_2_) * sVar21;
                    sVar21 = auVar41._4_2_;
                    auVar39._4_2_ =
                         (sVar21 < (short)auVar51._4_2_) * auVar51._4_2_ |
                         (ushort)(sVar21 >= (short)auVar51._4_2_) * sVar21;
                    sVar21 = auVar41._6_2_;
                    auVar39._6_2_ =
                         (sVar21 < (short)auVar51._6_2_) * auVar51._6_2_ |
                         (ushort)(sVar21 >= (short)auVar51._6_2_) * sVar21;
                    sVar21 = auVar41._8_2_;
                    auVar39._8_2_ =
                         (sVar21 < (short)auVar51._8_2_) * auVar51._8_2_ |
                         (ushort)(sVar21 >= (short)auVar51._8_2_) * sVar21;
                    sVar21 = auVar41._10_2_;
                    auVar39._10_2_ =
                         (sVar21 < (short)auVar51._10_2_) * auVar51._10_2_ |
                         (ushort)(sVar21 >= (short)auVar51._10_2_) * sVar21;
                    sVar21 = auVar41._12_2_;
                    sVar25 = auVar41._14_2_;
                    auVar39._12_2_ =
                         (sVar21 < (short)auVar51._12_2_) * auVar51._12_2_ |
                         (ushort)(sVar21 >= (short)auVar51._12_2_) * sVar21;
                    auVar39._14_2_ =
                         (sVar25 < (short)auVar51._14_2_) * auVar51._14_2_ |
                         (ushort)(sVar25 >= (short)auVar51._14_2_) * sVar25;
                    auVar51 = psubsw(auVar51,auVar9);
                    auVar41 = psubsw(auVar38,auVar8);
                    sVar21 = auVar51._0_2_;
                    sVar28 = auVar41._0_2_;
                    sVar25 = auVar51._2_2_;
                    sVar43 = auVar41._2_2_;
                    sVar37 = auVar51._4_2_;
                    sVar44 = auVar41._4_2_;
                    sVar36 = auVar51._6_2_;
                    sVar45 = auVar41._6_2_;
                    sVar29 = auVar51._8_2_;
                    sVar46 = auVar41._8_2_;
                    sVar33 = auVar51._10_2_;
                    sVar47 = auVar41._10_2_;
                    sVar34 = auVar51._12_2_;
                    sVar48 = auVar41._12_2_;
                    sVar49 = auVar41._14_2_;
                    sVar35 = auVar51._14_2_;
                    puVar1 = (ushort *)((long)*b + lVar20);
                    *puVar1 = (ushort)(sVar28 < sVar21) * sVar21 |
                              (ushort)(sVar28 >= sVar21) * sVar28;
                    puVar1[1] = (ushort)(sVar43 < sVar25) * sVar25 |
                                (ushort)(sVar43 >= sVar25) * sVar43;
                    puVar1[2] = (ushort)(sVar44 < sVar37) * sVar37 |
                                (ushort)(sVar44 >= sVar37) * sVar44;
                    puVar1[3] = (ushort)(sVar45 < sVar36) * sVar36 |
                                (ushort)(sVar45 >= sVar36) * sVar45;
                    puVar1[4] = (ushort)(sVar46 < sVar29) * sVar29 |
                                (ushort)(sVar46 >= sVar29) * sVar46;
                    puVar1[5] = (ushort)(sVar47 < sVar33) * sVar33 |
                                (ushort)(sVar47 >= sVar33) * sVar47;
                    puVar1[6] = (ushort)(sVar48 < sVar34) * sVar34 |
                                (ushort)(sVar48 >= sVar34) * sVar48;
                    puVar1[7] = (ushort)(sVar49 < sVar35) * sVar35 |
                                (ushort)(sVar49 >= sVar35) * sVar49;
                    auVar41 = psubsw(auVar31,auVar8);
                    sVar28 = auVar41._0_2_;
                    auVar31._0_2_ =
                         (ushort)(sVar28 < sVar21) * sVar21 | (ushort)(sVar28 >= sVar21) * sVar28;
                    sVar21 = auVar41._2_2_;
                    auVar31._2_2_ =
                         (ushort)(sVar21 < sVar25) * sVar25 | (ushort)(sVar21 >= sVar25) * sVar21;
                    sVar21 = auVar41._4_2_;
                    auVar31._4_2_ =
                         (ushort)(sVar21 < sVar37) * sVar37 | (ushort)(sVar21 >= sVar37) * sVar21;
                    sVar21 = auVar41._6_2_;
                    auVar31._6_2_ =
                         (ushort)(sVar21 < sVar36) * sVar36 | (ushort)(sVar21 >= sVar36) * sVar21;
                    sVar21 = auVar41._8_2_;
                    auVar31._8_2_ =
                         (ushort)(sVar21 < sVar29) * sVar29 | (ushort)(sVar21 >= sVar29) * sVar21;
                    sVar21 = auVar41._10_2_;
                    auVar31._10_2_ =
                         (ushort)(sVar21 < sVar33) * sVar33 | (ushort)(sVar21 >= sVar33) * sVar21;
                    sVar21 = auVar41._12_2_;
                    sVar25 = auVar41._14_2_;
                    auVar31._12_2_ =
                         (ushort)(sVar21 < sVar34) * sVar34 | (ushort)(sVar21 >= sVar34) * sVar21;
                    auVar31._14_2_ =
                         (ushort)(sVar25 < sVar35) * sVar35 | (ushort)(sVar25 >= sVar35) * sVar25;
                    auVar38 = *(undefined1 (*) [16])((long)*palVar12 + lVar20);
                    auVar41 = auVar39;
                  }
                  if ((int)local_a0 == iVar19) {
                    palVar14 = palVar13;
                  }
                  for (iVar10 = 0; iVar10 != 8; iVar10 = iVar10 + 1) {
                    auVar30._0_8_ = auVar31._0_8_ << 0x10;
                    auVar30._8_8_ = auVar31._8_8_ << 0x10 | auVar31._0_8_ >> 0x30;
                    auVar31 = auVar30 | ZEXT416(0x8000);
                    auVar38 = auVar41;
                    for (lVar20 = 0; uVar17 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
                      psVar2 = (short *)((long)*palVar15 + lVar20);
                      sVar25 = *psVar2;
                      sVar37 = psVar2[1];
                      sVar36 = psVar2[2];
                      sVar29 = psVar2[3];
                      sVar33 = psVar2[4];
                      sVar34 = psVar2[5];
                      sVar35 = psVar2[6];
                      sVar28 = psVar2[7];
                      sVar21 = auVar31._0_2_;
                      auVar40._0_2_ =
                           (ushort)(sVar25 < sVar21) * sVar21 | (ushort)(sVar25 >= sVar21) * sVar25;
                      sVar21 = auVar31._2_2_;
                      auVar40._2_2_ =
                           (ushort)(sVar37 < sVar21) * sVar21 | (ushort)(sVar37 >= sVar21) * sVar37;
                      sVar21 = auVar31._4_2_;
                      auVar40._4_2_ =
                           (ushort)(sVar36 < sVar21) * sVar21 | (ushort)(sVar36 >= sVar21) * sVar36;
                      sVar21 = auVar31._6_2_;
                      auVar40._6_2_ =
                           (ushort)(sVar29 < sVar21) * sVar21 | (ushort)(sVar29 >= sVar21) * sVar29;
                      sVar21 = auVar31._8_2_;
                      auVar40._8_2_ =
                           (ushort)(sVar33 < sVar21) * sVar21 | (ushort)(sVar33 >= sVar21) * sVar33;
                      sVar21 = auVar31._10_2_;
                      auVar40._10_2_ =
                           (ushort)(sVar34 < sVar21) * sVar21 | (ushort)(sVar34 >= sVar21) * sVar34;
                      sVar21 = auVar31._12_2_;
                      auVar40._12_2_ =
                           (ushort)(sVar35 < sVar21) * sVar21 | (ushort)(sVar35 >= sVar21) * sVar35;
                      sVar21 = auVar31._14_2_;
                      auVar40._14_2_ =
                           (ushort)(sVar28 < sVar21) * sVar21 | (ushort)(sVar28 >= sVar21) * sVar28;
                      *(undefined1 (*) [16])((long)*palVar15 + lVar20) = auVar40;
                      sVar21 = auVar38._0_2_;
                      auVar41._0_2_ =
                           (sVar21 < (short)auVar40._0_2_) * auVar40._0_2_ |
                           (ushort)(sVar21 >= (short)auVar40._0_2_) * sVar21;
                      sVar21 = auVar38._2_2_;
                      auVar41._2_2_ =
                           (sVar21 < (short)auVar40._2_2_) * auVar40._2_2_ |
                           (ushort)(sVar21 >= (short)auVar40._2_2_) * sVar21;
                      sVar21 = auVar38._4_2_;
                      auVar41._4_2_ =
                           (sVar21 < (short)auVar40._4_2_) * auVar40._4_2_ |
                           (ushort)(sVar21 >= (short)auVar40._4_2_) * sVar21;
                      sVar21 = auVar38._6_2_;
                      auVar41._6_2_ =
                           (sVar21 < (short)auVar40._6_2_) * auVar40._6_2_ |
                           (ushort)(sVar21 >= (short)auVar40._6_2_) * sVar21;
                      sVar21 = auVar38._8_2_;
                      auVar41._8_2_ =
                           (sVar21 < (short)auVar40._8_2_) * auVar40._8_2_ |
                           (ushort)(sVar21 >= (short)auVar40._8_2_) * sVar21;
                      sVar21 = auVar38._10_2_;
                      auVar41._10_2_ =
                           (sVar21 < (short)auVar40._10_2_) * auVar40._10_2_ |
                           (ushort)(sVar21 >= (short)auVar40._10_2_) * sVar21;
                      sVar21 = auVar38._12_2_;
                      sVar25 = auVar38._14_2_;
                      auVar41._12_2_ =
                           (sVar21 < (short)auVar40._12_2_) * auVar40._12_2_ |
                           (ushort)(sVar21 >= (short)auVar40._12_2_) * sVar21;
                      auVar41._14_2_ =
                           (sVar25 < (short)auVar40._14_2_) * auVar40._14_2_ |
                           (ushort)(sVar25 >= (short)auVar40._14_2_) * sVar25;
                      auVar38 = psubsw(auVar40,auVar9);
                      auVar31 = psubsw(auVar31,auVar8);
                      auVar42._0_2_ = -(ushort)(auVar38._0_2_ < auVar31._0_2_);
                      auVar42._2_2_ = -(ushort)(auVar38._2_2_ < auVar31._2_2_);
                      auVar42._4_2_ = -(ushort)(auVar38._4_2_ < auVar31._4_2_);
                      auVar42._6_2_ = -(ushort)(auVar38._6_2_ < auVar31._6_2_);
                      auVar42._8_2_ = -(ushort)(auVar38._8_2_ < auVar31._8_2_);
                      auVar42._10_2_ = -(ushort)(auVar38._10_2_ < auVar31._10_2_);
                      auVar42._12_2_ = -(ushort)(auVar38._12_2_ < auVar31._12_2_);
                      auVar42._14_2_ = -(ushort)(auVar38._14_2_ < auVar31._14_2_);
                      if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar42 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar42 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar42 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar42 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar42 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar42 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar42 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar42 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar42 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar42 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42._14_2_ >> 7 & 1) == 0) && (auVar42._14_2_ & 0x8000) == 0)
                      goto LAB_0051978d;
                      auVar38 = auVar41;
                    }
                    auVar41 = auVar38;
                  }
LAB_0051978d:
                  sVar29 = auVar41._0_2_;
                  auVar32._0_2_ = -(ushort)(auVar27._0_2_ < sVar29);
                  sVar33 = auVar41._2_2_;
                  auVar32._2_2_ = -(ushort)(auVar27._2_2_ < sVar33);
                  sVar34 = auVar41._4_2_;
                  auVar32._4_2_ = -(ushort)(auVar27._4_2_ < sVar34);
                  sVar35 = auVar41._6_2_;
                  auVar32._6_2_ = -(ushort)(auVar27._6_2_ < sVar35);
                  sVar25 = auVar41._8_2_;
                  auVar32._8_2_ = -(ushort)(auVar27._8_2_ < sVar25);
                  sVar21 = auVar41._10_2_;
                  auVar32._10_2_ = -(ushort)(auVar27._10_2_ < sVar21);
                  sVar36 = auVar41._12_2_;
                  sVar37 = auVar41._14_2_;
                  auVar32._12_2_ = -(ushort)(auVar27._12_2_ < sVar36);
                  auVar32._14_2_ = -(ushort)(auVar27._14_2_ < sVar37);
                  palVar13 = palVar12;
                  palVar12 = palVar15;
                  if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar32 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar32 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar32 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar32._14_2_ >> 7 & 1) != 0) || (auVar32._14_2_ & 0x8000) != 0) {
                    uVar50 = (ushort)(sVar25 < sVar29) * sVar29 |
                             (ushort)(sVar25 >= sVar29) * sVar25;
                    uVar52 = (ushort)(sVar21 < sVar33) * sVar33 |
                             (ushort)(sVar21 >= sVar33) * sVar21;
                    uVar53 = (ushort)(sVar36 < sVar34) * sVar34 |
                             (ushort)(sVar36 >= sVar34) * sVar36;
                    uVar54 = (ushort)(sVar37 < sVar35) * sVar35 |
                             (ushort)(sVar37 >= sVar35) * sVar37;
                    sVar25 = (ushort)(0 < sVar25) * sVar25;
                    sVar21 = (ushort)(0 < sVar21) * sVar21;
                    sVar36 = (ushort)(0 < sVar36) * sVar36;
                    sVar37 = (ushort)(0 < sVar37) * sVar37;
                    uVar50 = ((short)uVar53 < (short)uVar50) * uVar50 |
                             ((short)uVar53 >= (short)uVar50) * uVar53;
                    uVar52 = ((short)uVar54 < (short)uVar52) * uVar52 |
                             ((short)uVar54 >= (short)uVar52) * uVar54;
                    uVar53 = (sVar25 < (short)uVar53) * uVar53 |
                             (ushort)(sVar25 >= (short)uVar53) * sVar25;
                    uVar54 = (sVar21 < (short)uVar54) * uVar54 |
                             (ushort)(sVar21 >= (short)uVar54) * sVar21;
                    uVar55 = (ushort)(sVar36 < sVar25) * sVar25 |
                             (ushort)(sVar36 >= sVar25) * sVar36;
                    uVar56 = (ushort)(sVar37 < sVar21) * sVar21 |
                             (ushort)(sVar37 >= sVar21) * sVar37;
                    sVar36 = (ushort)(0 < sVar36) * sVar36;
                    sVar37 = (ushort)(0 < sVar37) * sVar37;
                    uVar50 = ((short)uVar52 < (short)uVar50) * uVar50 |
                             ((short)uVar52 >= (short)uVar50) * uVar52;
                    auVar26._0_4_ =
                         CONCAT22(((short)uVar53 < (short)uVar52) * uVar52 |
                                  ((short)uVar53 >= (short)uVar52) * uVar53,uVar50);
                    auVar26._4_2_ =
                         ((short)uVar54 < (short)uVar53) * uVar53 |
                         ((short)uVar54 >= (short)uVar53) * uVar54;
                    auVar26._6_2_ =
                         ((short)uVar55 < (short)uVar54) * uVar54 |
                         ((short)uVar55 >= (short)uVar54) * uVar55;
                    auVar26._8_2_ =
                         ((short)uVar56 < (short)uVar55) * uVar55 |
                         ((short)uVar56 >= (short)uVar55) * uVar56;
                    auVar26._10_2_ =
                         (sVar36 < (short)uVar56) * uVar56 |
                         (ushort)(sVar36 >= (short)uVar56) * sVar36;
                    auVar26._12_2_ =
                         (ushort)(sVar37 < sVar36) * sVar36 | (ushort)(sVar37 >= sVar36) * sVar37;
                    auVar26._14_2_ = (ushort)(0 < sVar37) * sVar37;
                    if ((short)(0x7ffe - (short)iVar11) < (short)uVar50) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      s2Len = (int)uVar18;
                      goto LAB_00519851;
                    }
                    auVar27 = pshuflw(auVar26,auVar26,0);
                    auVar27._4_4_ = auVar27._0_4_;
                    auVar27._8_4_ = auVar27._0_4_;
                    auVar27._12_4_ = auVar27._0_4_;
                    local_a0 = uVar18 & 0xffffffff;
                  }
                  uVar18 = uVar18 + 1;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_striped_profile_sse2_128_16",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}